

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_BlockSizeDoubling_Test::TestBody(ArenaTest_BlockSizeDoubling_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  uint64_t uVar2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var3;
  char *pcVar4;
  uint64_t second_block_size;
  AssertionResult gtest_ar;
  uint64_t first_block_size;
  Arena arena;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  internal local_d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  AssertHelper local_b8;
  ThreadSafeArena local_b0;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b0);
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_e0._M_head_impl._4_4_ << 0x20);
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       protobuf::internal::ThreadSafeArena::SpaceUsed(&local_b0);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_d8,"0","arena.SpaceUsed()",(int *)&local_e0,(unsigned_long *)&local_c8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6b8,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  local_e0._M_head_impl = local_e0._M_head_impl & 0xffffffff00000000;
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_b0);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            (local_d8,"0","arena.SpaceAllocated()",(int *)&local_e0,(unsigned_long *)&local_c8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6b9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (local_c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_c8._M_head_impl + 8))();
    }
  }
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  Arena::AllocateForArray((Arena *)&local_b0,8);
  local_c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_b0);
  while( true ) {
    pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_b0);
    if (pbVar1 != local_c8._M_head_impl) break;
    Arena::AllocateForArray((Arena *)&local_b0,8);
  }
  local_e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_b0);
  testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
            (local_d8,"arena.SpaceAllocated()","first_block_size",(unsigned_long *)&local_e0,
             (unsigned_long *)&local_c8);
  if (local_d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_e0);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6c3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    _Var3._M_head_impl = local_e0._M_head_impl;
  }
  else {
    if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_d0,local_d0);
    }
    uVar2 = protobuf::internal::ThreadSafeArena::SpaceAllocated(&local_b0);
    local_e0._M_head_impl = uVar2 - local_c8._M_head_impl;
    local_c0._M_head_impl = local_c8._M_head_impl * 2;
    testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
              (local_d8,"second_block_size","2*first_block_size",(unsigned_long *)&local_e0,
               (unsigned_long *)&local_c0);
    if (local_d8[0] != (internal)0x0) goto LAB_00515655;
    testing::Message::Message((Message *)&local_c0);
    if (local_d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar4 = (local_d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x6c6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    _Var3._M_head_impl = local_c0._M_head_impl;
  }
  if (_Var3._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var3._M_head_impl + 8))();
  }
LAB_00515655:
  if (local_d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_d0,local_d0);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b0);
  return;
}

Assistant:

TEST(ArenaTest, BlockSizeDoubling) {
  Arena arena;
  EXPECT_EQ(0, arena.SpaceUsed());
  EXPECT_EQ(0, arena.SpaceAllocated());

  // Allocate something to get initial block size.
  Arena::CreateArray<char>(&arena, 1);
  auto first_block_size = arena.SpaceAllocated();

  // Keep allocating until space used increases.
  while (arena.SpaceAllocated() == first_block_size) {
    Arena::CreateArray<char>(&arena, 1);
  }
  ASSERT_GT(arena.SpaceAllocated(), first_block_size);
  auto second_block_size = (arena.SpaceAllocated() - first_block_size);

  EXPECT_GE(second_block_size, 2*first_block_size);
}